

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O3

void __thiscall
helics::apps::PhasorGenerator::set(PhasorGenerator *this,string_view parameter,double val)

{
  int iVar1;
  long *__s1;
  size_t __n;
  size_type __rlen;
  double dVar2;
  double __x;
  double local_28;
  double local_20;
  
  __s1 = (long *)parameter._M_str;
  __n = parameter._M_len;
  switch(__n) {
  case 1:
    iVar1 = bcmp(__s1,"f",__n);
    if (iVar1 == 0) {
LAB_0020cfe3:
      this->frequency = val;
      return;
    }
    iVar1 = bcmp(__s1,"a",__n);
    goto joined_r0x0020cea6;
  case 3:
    iVar1 = bcmp(__s1,"amp",__n);
joined_r0x0020cea6:
    if (iVar1 == 0) {
LAB_0020cfce:
      this->amplitude = val;
      return;
    }
    break;
  case 4:
    iVar1 = bcmp(__s1,"freq",__n);
    if (iVar1 == 0) goto LAB_0020cfe3;
    iVar1 = bcmp(__s1,"dfdt",__n);
    if (iVar1 == 0) {
      this->dfdt = val;
      return;
    }
    if ((int)*__s1 == 0x74646164) {
      this->dAdt = val;
      return;
    }
    break;
  case 6:
    iVar1 = bcmp(__s1,"period",__n);
    if (iVar1 == 0) {
      val = 1.0 / val;
      goto LAB_0020cfe3;
    }
    iVar1 = bcmp(__s1,"offset",__n);
    if (iVar1 == 0) {
      __x = val - this->offset;
      dVar2 = cos(__x);
      local_20 = sin(__x);
      local_28 = dVar2;
      std::complex<double>::operator*=(&this->state,(complex<double> *)&local_28);
      this->offset = val;
      return;
    }
    break;
  case 9:
    if ((char)__s1[1] == 'y' && *__s1 == 0x636e657571657266) goto LAB_0020cfe3;
    iVar1 = bcmp(__s1,"amplitude",__n);
    if (iVar1 != 0) {
      iVar1 = bcmp(__s1,"bias_real",__n);
      if (iVar1 == 0) {
        this->bias_real = val;
        return;
      }
      if ((char)__s1[1] == 'g' && *__s1 == 0x616d695f73616962) {
        this->bias_imag = val;
        return;
      }
      break;
    }
    goto LAB_0020cfce;
  }
  SignalGenerator::set(&this->super_SignalGenerator,(string_view)parameter,val);
  return;
}

Assistant:

void PhasorGenerator::set(std::string_view parameter, double val)
    {
        if ((parameter == "frequency") || (parameter == "freq") || (parameter == "f")) {
            frequency = val;
        } else if (parameter == "period") {
            frequency = 1.0 / val;
        } else if (parameter == "dfdt") {
            dfdt = val;
        } else if (parameter == "dadt") {
            dAdt = val;
        } else if ((parameter == "amplitude") || (parameter == "amp") || (parameter == "a")) {
            amplitude = val;
        } else if (parameter == "bias_real") {
            bias_real = val;
        } else if (parameter == "bias_imag") {
            bias_imag = val;
        } else if (parameter == "offset") {
            state *= std::polar(1.0, (val - offset));
            offset = val;
        } else {
            SignalGenerator::set(parameter, val);
        }
    }